

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void Excel::Parser::parseSST(Record *record,IStorage *storage)

{
  long lVar1;
  long *in_RSI;
  Record *in_RDI;
  int32_t i;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  sst;
  int32_t uniqueStrings;
  int32_t totalStrings;
  BiffVersion in_stack_000000b8;
  int32_t in_stack_000000bc;
  vector<int,_std::allocator<int>_> *in_stack_000000c0;
  Stream *in_stack_000000c8;
  Stream *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar2;
  wstring local_68 [28];
  int32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffbc;
  Stream *in_stack_ffffffffffffffc0;
  
  Record::dataStream(in_RDI);
  uVar2 = 4;
  Stream::read<int>(in_stack_ffffffffffffffc0,
                    (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    in_stack_ffffffffffffffb4);
  Record::dataStream(in_RDI);
  Stream::read<int>(in_stack_ffffffffffffffc0,
                    (int *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    in_stack_ffffffffffffffb4);
  std::
  allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::allocator((allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)0x1318a0);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            *)CONCAT44(uVar2,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78,
           (allocator_type *)in_stack_ffffffffffffff70);
  std::
  allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::~allocator((allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *)0x1318c0);
  for (iVar3 = 0; iVar3 < 0; iVar3 = iVar3 + 1) {
    lVar1 = (long)iVar3;
    in_stack_ffffffffffffff70 = Record::dataStream(in_RDI);
    Record::borders(in_RDI);
    loadString_abi_cxx11_(in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,in_stack_000000b8);
    (**(code **)(*in_RSI + 0x10))(in_RSI,0,lVar1,local_68);
    std::__cxx11::wstring::~wstring(local_68);
  }
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

inline void
Parser::parseSST( Record & record, IStorage & storage )
{
	int32_t totalStrings = 0;
	int32_t uniqueStrings = 0;

	record.dataStream().read( totalStrings, 4 );
	record.dataStream().read( uniqueStrings, 4 );

	std::vector< std::wstring > sst( uniqueStrings );

	for( int32_t i = 0; i < uniqueStrings; ++i )
		storage.onSharedString( uniqueStrings, i,
			loadString( record.dataStream(), record.borders() ) );
}